

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucm.cpp
# Opt level: O2

void ucm_moveMappings(UCMTable *base,UCMTable *ext)

{
  byte bVar1;
  int8_t iVar2;
  int8_t iVar3;
  int8_t iVar4;
  anon_union_4_2_095b93d3_for_b aVar5;
  anon_union_4_2_095b93d3_for_b *bytes;
  UCMapping *pUVar6;
  UCMapping *pUVar7;
  UCMapping *m;
  
  m = base->mappings;
  pUVar7 = m + base->mappingsLength;
  while (m < pUVar7) {
    bVar1 = m->moveFlag;
    if (bVar1 == 0) {
      m = m + 1;
    }
    else {
      m->moveFlag = '\0';
      if ((ext != (UCMTable *)0x0) && ((bVar1 & 1) != 0)) {
        pUVar6 = m;
        if (m->uLen != '\x01') {
          pUVar6 = (UCMapping *)(base->codePoints + m->u);
        }
        if (m->bLen < '\x05') {
          bytes = &m->b;
        }
        else {
          bytes = (anon_union_4_2_095b93d3_for_b *)(base->bytes + (m->b).idx);
        }
        ucm_addMapping(ext,m,&pUVar6->u,bytes->bytes);
      }
      pUVar6 = pUVar7 + -1;
      if (m < pUVar6) {
        iVar2 = pUVar7[-1].bLen;
        iVar3 = pUVar7[-1].f;
        iVar4 = pUVar7[-1].moveFlag;
        m->uLen = pUVar7[-1].uLen;
        m->bLen = iVar2;
        m->f = iVar3;
        m->moveFlag = iVar4;
        aVar5 = pUVar6->b;
        m->u = pUVar6->u;
        m->b = aVar5;
      }
      base->mappingsLength = base->mappingsLength + -1;
      base->isSorted = '\0';
      pUVar7 = pUVar6;
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
ucm_moveMappings(UCMTable *base, UCMTable *ext) {
    UCMapping *mb, *mbLimit;
    int8_t flag;

    mb=base->mappings;
    mbLimit=mb+base->mappingsLength;

    while(mb<mbLimit) {
        flag=mb->moveFlag;
        if(flag!=0) {
            /* reset the move flag */
            mb->moveFlag=0;

            if(ext!=NULL && (flag&UCM_MOVE_TO_EXT)) {
                /* add the mapping to the extension table */
                ucm_addMapping(ext, mb, UCM_GET_CODE_POINTS(base, mb), UCM_GET_BYTES(base, mb));
            }

            /* remove this mapping: move the last base mapping down and overwrite the current one */
            if(mb<(mbLimit-1)) {
                uprv_memcpy(mb, mbLimit-1, sizeof(UCMapping));
            }
            --mbLimit;
            --base->mappingsLength;
            base->isSorted=FALSE;
        } else {
            ++mb;
        }
    }
}